

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::resizeSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  BinaryCollection *binaryRegistry;
  undefined1 auVar1 [16];
  Window *pWVar2;
  TestStatus *pTVar3;
  Display *pDVar4;
  VkDevice device;
  VkResult VVar5;
  TestError *this;
  deUint32 i;
  long lVar6;
  size_t numCommandBuffers;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  deUint32 imageNdx;
  VkFence imageReadyFence;
  VkPipelineStageFlags waitDstStage;
  VkSemaphore imageReadySemaphore;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  VkPresentInfoKHR presentInfo;
  VkSubmitInfo submitInfo;
  VkSurfaceCapabilitiesKHR capabilities;
  VkSwapchainCreateInfoKHR swapchainInfo;
  InstanceHelper instHelper;
  TriangleRenderer renderer;
  SimpleAllocator allocator;
  uint *puVar14;
  uint local_e5c;
  Window *local_e58;
  undefined8 *local_e50;
  VkSurfaceKHR local_e48;
  Context *local_e40;
  deUint64 local_e38;
  undefined4 local_e2c;
  undefined1 local_e28 [16];
  PFN_vkReallocationFunction local_e18;
  PFN_vkFreeFunction local_e10;
  undefined1 local_e08 [8];
  undefined1 auStack_e00 [16];
  VkAllocationCallbacks *pVStack_df0;
  undefined1 local_de8 [8];
  undefined1 auStack_de0 [16];
  VkAllocationCallbacks *pVStack_dd0;
  TestStatus *local_dc8;
  Display *local_dc0;
  long local_db8;
  VkCommandBuffer local_db0;
  deUint64 local_da8;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_da0;
  deUint64 local_d88;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_d80;
  VkDevice local_d78;
  VkAllocationCallbacks *pVStack_d70;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  local_d68;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_d50;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_d38;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  local_d20;
  VkExtent2D local_d08;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_d00;
  Enum<vk::VkResult,_4UL> local_ce8;
  undefined4 local_cd8;
  deUint64 *local_cd0;
  undefined4 local_cc8;
  undefined1 *local_cc0;
  uint *local_cb8;
  undefined8 local_cb0;
  NativeObjects local_ca8;
  undefined1 local_c88 [8];
  DeviceInterface *pDStack_c80;
  VkDevice local_c78;
  VkAllocationCallbacks *pVStack_c70;
  undefined4 *local_c68;
  deUint32 local_c60;
  VkCommandBuffer *local_c58;
  deUint32 local_c50;
  deUint64 *local_c48;
  ios_base local_c10 [412];
  VkSurfaceCapabilitiesKHR local_a74;
  VkSwapchainCreateInfoKHR local_a40;
  undefined1 local_9d8 [32];
  DestroyInstanceFunc p_Stack_9b8;
  VkAllocationCallbacks *local_9b0;
  InstanceDriver local_9a8;
  undefined1 local_820 [8];
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_818;
  VkDevice local_810;
  VkAllocationCallbacks *pVStack_808;
  VkAllocationCallbacks *local_800;
  DeviceDriver local_7f8;
  VkQueue local_340;
  TriangleRenderer local_338;
  SimpleAllocator local_250;
  
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)local_9d8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_820 = (undefined1  [8])&aStack_818;
  aStack_818.m_align = 0x10000000100;
  local_e40 = context;
  NativeObjects::NativeObjects
            (&local_ca8,(Context *)context->m_testCtx->m_platform,(Extensions *)local_9d8,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_820);
  puVar14 = (uint *)0x0;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_820,&local_9a8.super_InstanceInterface,
             (VkInstance)local_9d8._24_8_,wsiType,
             local_ca8.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_ca8.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_d78 = local_810;
  pVStack_d70 = pVStack_808;
  local_d88 = (deUint64)local_820;
  aStack_d80.m_data = aStack_818.m_data;
  local_e48.m_internal = (deUint64)local_820;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_820,(Context *)local_e40->m_testCtx->m_cmdLine,
             &local_9a8.super_InstanceInterface,(VkInstance)local_9d8._24_8_,(VkSurfaceKHR)local_820
             ,(VkAllocationCallbacks *)0x0);
  ::vk::wsi::getPlatformProperties(wsiType);
  local_dc0 = local_ca8.display.
              super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr;
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
            (&local_a74,&local_9a8.super_InstanceInterface,(VkPhysicalDevice)local_820,local_e48);
  device = local_810;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)local_c88,&local_9a8.super_InstanceInterface,
             (VkPhysicalDevice)local_820);
  ::vk::SimpleAllocator::SimpleAllocator
            (&local_250,&local_7f8.super_DeviceInterface,device,
             (VkPhysicalDeviceMemoryProperties *)local_c88);
  local_e50 = (undefined8 *)operator_new(0x18);
  local_e58 = local_ca8.window.
              super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr;
  *local_e50 = 0x8000000080;
  local_e50[1] = 0x10000000100;
  local_e50[2] = 0x20000000200;
  auVar1 = _DAT_00ac4b80;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = local_a74.minImageExtent.width;
  auVar9._4_4_ = local_a74.minImageExtent.height;
  lVar6 = 0;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = local_a74.maxImageExtent.width;
  auVar10._4_4_ = local_a74.maxImageExtent.height;
  auVar9 = auVar9 ^ _DAT_00ac4b80;
  auVar10 = auVar10 ^ _DAT_00ac4b80;
  do {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_e50[lVar6];
    iVar12 = SUB164(auVar11 ^ auVar1,0);
    iVar13 = SUB164(auVar11 ^ auVar1,4);
    uVar7 = CONCAT44(-(uint)(iVar13 < auVar9._4_4_),-(uint)(iVar12 < auVar9._0_4_));
    uVar8 = CONCAT44(-(uint)(iVar13 < auVar10._4_4_),-(uint)(iVar12 < auVar10._0_4_));
    local_e50[lVar6] =
         ~uVar7 & (~uVar8 & (ulong)local_a74.maxImageExtent | local_e50[lVar6] & uVar8) |
         (ulong)local_a74.minImageExtent & uVar7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  stack0xfffffffffffff228 = (undefined1  [16])0x0;
  _local_de8 = (undefined1  [16])0x0;
  lVar6 = 0;
  local_dc8 = __return_storage_ptr__;
  do {
    local_db8 = lVar6;
    getBasicSwapchainParameters
              (&local_a40,wsiType,&local_9a8.super_InstanceInterface,(VkPhysicalDevice)local_820,
               local_e48,(UVec2 *)(local_e50 + lVar6),(deUint32)puVar14);
    local_a40.oldSwapchain.m_internal = (deUint64)local_de8;
    ::vk::createSwapchainKHR
              ((Move<vk::Handle<(vk::HandleType)26>_> *)local_e08,&local_7f8.super_DeviceInterface,
               device,&local_a40,(VkAllocationCallbacks *)0x0);
    ::vk::wsi::getSwapchainImages
              ((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)(local_e28 + 8),&local_7f8.super_DeviceInterface,device,(VkSwapchainKHR)local_e08)
    ;
    binaryRegistry = local_e40->m_progCollection;
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    vector(&local_da0,
           (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *
           )(local_e28 + 8));
    local_c88._0_4_ = local_a40.imageExtent.width;
    local_c88._4_4_ = local_a40.imageExtent.height;
    TriangleRenderer::TriangleRenderer
              (&local_338,&local_7f8.super_DeviceInterface,device,&local_250.super_Allocator,
               binaryRegistry,&local_da0,local_a40.imageFormat,(UVec2 *)local_c88);
    if (local_da0.
        super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_da0.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_da0.
                            super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_da0.
                            super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    numCommandBuffers = 0;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_c88,&local_7f8.super_DeviceInterface,
               device,2,aStack_818.m_align._0_4_,(VkAllocationCallbacks *)0x0);
    DStack_d00.m_device = local_c78;
    DStack_d00.m_allocator = pVStack_c70;
    local_d08.width = local_c88._0_4_;
    local_d08.height = local_c88._4_4_;
    DStack_d00.m_deviceIface = pDStack_c80;
    uVar8 = (long)local_e18 - local_e28._8_8_ >> 2;
    createFences(&local_d20,&local_7f8.super_DeviceInterface,device,uVar8);
    createSemaphores(&local_d38,&local_7f8.super_DeviceInterface,device,uVar8 | 1);
    createSemaphores(&local_d50,&local_7f8.super_DeviceInterface,device,uVar8);
    allocateCommandBuffers
              (&local_d68,&local_7f8.super_DeviceInterface,device,(VkCommandPool)local_d08,
               (VkCommandBufferLevel)uVar8,numCommandBuffers);
    uVar7 = 0;
    do {
      local_e38 = ((local_d20.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [uVar7 % (ulong)((long)local_d20.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_d20.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                  super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
      local_e28._0_8_ =
           ((local_d38.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [uVar7 % (ulong)((long)local_d38.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d38.
                                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
           super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
      local_e5c = 0xffffffff;
      if (uVar8 <= uVar7) {
        VVar5 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x16])
                          (&local_7f8,device,1,&local_e38,1,0xffffffffffffffff);
        ::vk::checkResult(VVar5,
                          "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x5f8);
      }
      VVar5 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x14])
                        (&local_7f8,device,1,&local_e38);
      ::vk::checkResult(VVar5,"vkd.resetFences(device, 1, &imageReadyFence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x5fa);
      puVar14 = &local_e5c;
      VVar5 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x7b])
                        (&local_7f8,device,local_e08,0xffffffffffffffff,local_e28._0_8_,local_e38);
      if (VVar5 == VK_SUBOPTIMAL_KHR) {
        local_c88 = (undefined1  [8])local_e40->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_c80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c80,"Got ",4);
        local_ce8.m_getName = ::vk::getResultName;
        local_ce8.m_value = VK_SUBOPTIMAL_KHR;
        tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_ce8,(ostream *)&pDStack_c80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c80," at frame ",10);
        std::ostream::_M_insert<unsigned_long>((ulong)&pDStack_c80);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_c88,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_c80);
        std::ios_base::~ios_base(local_c10);
      }
      else {
        ::vk::checkResult(VVar5,"acquireResult",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x607);
      }
      if ((ulong)((long)local_e18 - local_e28._8_8_ >> 3) <= (ulong)local_e5c) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                   ,0x60a);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_da8 = ((local_d50.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [uVar7 % (ulong)((long)local_d50.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_d50.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                  super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
      local_db0 = ((local_d68.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [uVar7 % (ulong)((long)local_d68.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_d68.
                                           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                  super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
      local_e2c = 0x400;
      local_c88._0_4_ = 4;
      pDStack_c80 = (DeviceInterface *)0x0;
      local_c78 = (VkDevice)CONCAT44(local_c78._4_4_,1);
      pVStack_c70 = (VkAllocationCallbacks *)local_e28;
      local_c68 = &local_e2c;
      local_c60 = 1;
      local_c58 = &local_db0;
      local_c50 = 1;
      local_cd0 = &local_da8;
      local_ce8.m_getName = (GetNameFunc)CONCAT44(local_ce8.m_getName._4_4_,0x3b9acde9);
      local_ce8.m_value = VK_SUCCESS;
      local_ce8._12_4_ = 0;
      local_cd8 = 1;
      local_cc8 = 1;
      local_cc0 = local_e08;
      local_cb8 = &local_e5c;
      local_cb0 = 0;
      local_c48 = local_cd0;
      TriangleRenderer::recordFrame(&local_338,local_db0,local_e5c,(deUint32)uVar7);
      VVar5 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[2])
                        (&local_7f8,local_340,1,local_c88,0);
      ::vk::checkResult(VVar5,"vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x629);
      VVar5 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x7c])
                        (&local_7f8,local_340,&local_ce8);
      ::vk::checkResult(VVar5,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x62a);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x3c);
    VVar5 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[4])(&local_7f8,device);
    ::vk::checkResult(VVar5,"vkd.deviceWaitIdle(device)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x62e);
    local_c78 = (VkDevice)auStack_e00._8_8_;
    pVStack_c70 = pVStack_df0;
    local_c88 = local_e08;
    pDStack_c80 = (DeviceInterface *)auStack_e00._0_8_;
    _local_e08 = (undefined1  [16])0x0;
    stack0xfffffffffffff208 = (undefined1  [16])0x0;
    if (local_de8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)26>_> *)(local_de8 + 8),
                 (VkSwapchainKHR)local_de8);
    }
    pVStack_dd0 = pVStack_c70;
    auStack_de0._8_8_ = local_c78;
    auStack_de0._0_8_ = pDStack_c80;
    local_de8 = local_c88;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector(&local_d68);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector(&local_d50);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector(&local_d38);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::~vector(&local_d20);
    if (local_d08 != (VkExtent2D)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&DStack_d00,(VkCommandPool)local_d08);
    }
    TriangleRenderer::~TriangleRenderer(&local_338);
    if ((PFN_vkAllocationFunction)local_e28._8_8_ != (PFN_vkAllocationFunction)0x0) {
      operator_delete((void *)local_e28._8_8_,(long)local_e10 - local_e28._8_8_);
    }
    if (local_e08 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)26>_> *)(local_e08 + 8),
                 (VkSwapchainKHR)local_e08);
    }
    lVar6 = local_db8 + 1;
    if (lVar6 == 3) {
      local_c88 = (undefined1  [8])&local_c78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c88,"Resizing tests succeeded","");
      pTVar3 = local_dc8;
      pWVar2 = local_e58;
      local_dc8->m_code = QP_TEST_RESULT_PASS;
      (local_dc8->m_description)._M_dataplus._M_p = (pointer)&(local_dc8->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_dc8->m_description,local_c88,
                 (long)&pDStack_c80->_vptr_DeviceInterface + (long)local_c88);
      pDVar4 = local_dc0;
      if (local_c88 != (undefined1  [8])&local_c78) {
        operator_delete((void *)local_c88,(ulong)(local_c78 + 1));
      }
      if (local_de8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)26>_> *)(local_de8 + 8),
                   (VkSwapchainKHR)local_de8);
      }
      operator_delete(local_e50,0x18);
      ::vk::DeviceDriver::~DeviceDriver(&local_7f8);
      if (local_810 != (VkDevice)0x0) {
        (*(code *)pVStack_808)(local_810,local_800);
      }
      if (local_e48.m_internal != 0) {
        (**(code **)(*(long *)aStack_d80 + 0x68))
                  (aStack_d80.m_align,local_d78,local_e48.m_internal,pVStack_d70);
      }
      (*pWVar2->_vptr_Window[1])(pWVar2);
      (*pDVar4->_vptr_Display[1])(pDVar4);
      ::vk::InstanceDriver::~InstanceDriver(&local_9a8);
      if ((VkInstance)local_9d8._24_8_ != (VkInstance)0x0) {
        (*p_Stack_9b8)((VkInstance)local_9d8._24_8_,local_9b0);
      }
      stack0xfffffffffffff640 = (undefined1  [16])0x0;
      local_9b0 = (VkAllocationCallbacks *)0x0;
      if ((pointer)local_9d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_9d8._0_8_,local_9d8._16_8_ - local_9d8._0_8_);
      }
      return pTVar3;
    }
  } while( true );
}

Assistant:

tcu::TestStatus resizeSwapchainTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize			(256, 256);
	const InstanceHelper			instHelper			(context, wsiType);
	const NativeObjects				native				(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface				(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper			(context, instHelper.vki, *instHelper.instance, *surface);
	const PlatformProperties&		platformProperties	= getPlatformProperties(wsiType);
	const VkSurfaceCapabilitiesKHR	capabilities		= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, devHelper.physicalDevice, *surface);
	const DeviceInterface&			vkd					= devHelper.vkd;
	const VkDevice					device				= *devHelper.device;
	SimpleAllocator					allocator			(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	vector<tcu::UVec2>				sizes				= getSwapchainSizeSequence(capabilities, desiredSize);
	Move<VkSwapchainKHR>			prevSwapchain;

	DE_ASSERT(platformProperties.swapchainExtent != PlatformProperties::SWAPCHAIN_EXTENT_MUST_MATCH_WINDOW_SIZE);
	DE_UNREF(platformProperties);

	for (deUint32 sizeNdx = 0; sizeNdx < sizes.size(); ++sizeNdx)
	{
		// \todo [2016-05-30 jesse] This test currently waits for idle and
		// recreates way more than necessary when recreating the swapchain. Make
		// it match expected real app behavior better by smoothly switching from
		// old to new swapchain. Once that is done, it will also be possible to
		// test creating a new swapchain while images from the previous one are
		// still acquired.

		VkSwapchainCreateInfoKHR		swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, sizes[sizeNdx], 2);
		swapchainInfo.oldSwapchain = *prevSwapchain;

		Move<VkSwapchainKHR>			swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
		const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);
		const TriangleRenderer			renderer					(vkd,
																	device,
																	allocator,
																	context.getBinaryCollection(),
																	swapchainImages,
																	swapchainInfo.imageFormat,
																	tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));
		const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));
		const size_t					maxQueuedFrames				= swapchainImages.size()*2;

		// We need to keep hold of fences from vkAcquireNextImageKHR to actually
		// limit number of frames we allow to be queued.
		const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

		// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
		// the semaphore in same time as the fence we use to meter rendering.
		const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

		// For rest we simply need maxQueuedFrames as we will wait for image
		// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
		// previous uses must have completed.
		const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
		const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

		try
		{
			const deUint32	numFramesToRender	= 60;

			for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
			{
				const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
				const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
				deUint32			imageNdx			= ~0u;

				if (frameNdx >= maxQueuedFrames)
					VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

				VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

				{
					const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																			  *swapchain,
																			  std::numeric_limits<deUint64>::max(),
																			  imageReadySemaphore,
																			  imageReadyFence,
																			  &imageNdx);

					if (acquireResult == VK_SUBOPTIMAL_KHR)
						context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
					else
						VK_CHECK(acquireResult);
				}

				TCU_CHECK((size_t)imageNdx < swapchainImages.size());

				{
					const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
					const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
					const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
					const VkSubmitInfo			submitInfo					=
					{
						VK_STRUCTURE_TYPE_SUBMIT_INFO,
						DE_NULL,
						1u,
						&imageReadySemaphore,
						&waitDstStage,
						1u,
						&commandBuffer,
						1u,
						&renderingCompleteSemaphore
					};
					const VkPresentInfoKHR		presentInfo					=
					{
						VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
						DE_NULL,
						1u,
						&renderingCompleteSemaphore,
						1u,
						&*swapchain,
						&imageNdx,
						(VkResult*)DE_NULL
					};

					renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
					VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
					VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
				}
			}

			VK_CHECK(vkd.deviceWaitIdle(device));

			prevSwapchain = swapchain;
		}
		catch (...)
		{
			// Make sure device is idle before destroying resources
			vkd.deviceWaitIdle(device);
			throw;
		}
	}

	return tcu::TestStatus::pass("Resizing tests succeeded");
}